

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar16;
  int iVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  __m128i *palVar20;
  __m128i *ptr;
  __m128i *b;
  __m128i *ptr_00;
  __m128i *b_00;
  __m128i *ptr_01;
  __m128i *b_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  int16_t *ptr_04;
  int iVar21;
  size_t len;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  undefined2 uVar30;
  ulong uVar31;
  long lVar32;
  __m128i *ptr_05;
  undefined4 uVar34;
  undefined4 uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar41;
  ushort uVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar47;
  ulong uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar55;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ushort uVar62;
  ulong uVar63;
  ushort uVar66;
  ushort uVar67;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 auVar64 [16];
  ushort uVar68;
  ushort uVar73;
  undefined1 auVar65 [16];
  ushort uVar75;
  ushort uVar79;
  ushort uVar81;
  ushort uVar82;
  ushort uVar84;
  ushort uVar85;
  ushort uVar87;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar80;
  ushort uVar83;
  ushort uVar86;
  ushort uVar88;
  ushort uVar89;
  undefined1 auVar78 [16];
  short sVar90;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  undefined1 in_XMM5 [16];
  undefined1 auVar91 [16];
  short sVar99;
  undefined1 auVar92 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  short sVar104;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  undefined1 in_XMM10 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar113;
  undefined4 uVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  int iVar119;
  int iVar121;
  int iVar122;
  int iVar123;
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 in_XMM15 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_16_t e;
  __m128i_16_t h;
  __m128i *local_190;
  __m128i *local_188;
  __m128i *local_160;
  undefined1 local_158 [16];
  ushort local_148;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_140;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  ushort local_b8;
  ushort uStack_b6;
  ushort local_88;
  ushort uStack_86;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX_00;
  short sVar33;
  short sVar42;
  short sVar43;
  short sVar45;
  short sVar46;
  short sVar48;
  short sVar49;
  short sVar50;
  ushort uVar72;
  ushort uVar74;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          parasail_nw_stats_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_striped_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_striped_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_striped_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_striped_profile_sse41_128_16_cold_1();
        }
        else {
          uVar28 = uVar18 - 1;
          uVar31 = (ulong)uVar18 + 7 >> 3;
          uVar36 = (ulong)uVar28 % uVar31;
          pvVar5 = (profile->profile16).matches;
          pvVar6 = (profile->profile16).similar;
          iVar29 = -open;
          iVar21 = ppVar4->min;
          iVar26 = -iVar21;
          if (iVar21 != iVar29 && SBORROW4(iVar21,iVar29) == iVar21 + open < 0) {
            iVar26 = open;
          }
          iVar123 = ppVar4->max;
          ppVar19 = parasail_result_new_stats();
          if (ppVar19 != (parasail_result_t *)0x0) {
            iVar23 = (int)(uVar28 / uVar31);
            ppVar19->flag = ppVar19->flag | 0x8210801;
            palVar20 = parasail_memalign___m128i(0x10,uVar31);
            ptr = parasail_memalign___m128i(0x10,uVar31);
            b = parasail_memalign___m128i(0x10,uVar31);
            ptr_00 = parasail_memalign___m128i(0x10,uVar31);
            b_00 = parasail_memalign___m128i(0x10,uVar31);
            ptr_01 = parasail_memalign___m128i(0x10,uVar31);
            b_01 = parasail_memalign___m128i(0x10,uVar31);
            ptr_02 = parasail_memalign___m128i(0x10,uVar31);
            ptr_03 = parasail_memalign___m128i(0x10,uVar31);
            b_02 = parasail_memalign___m128i(0x10,uVar31);
            b_03 = parasail_memalign___m128i(0x10,uVar31);
            b_04 = parasail_memalign___m128i(0x10,uVar31);
            ptr_04 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            auVar76 = (undefined1  [16])0x0;
            len = CONCAT71((int7)((ulong)ptr_02 >> 8),ptr_03 == (__m128i *)0x0);
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = b_03 == (__m128i *)0x0;
            auVar37._0_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
            auVar37._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar57._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar57._8_8_ = -(ulong)(ptr_00 == (__m128i *)0x0);
            auVar37 = packssdw(auVar37,auVar57);
            auVar77._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar77._8_8_ = -(ulong)(ptr_01 == (__m128i *)0x0);
            auVar91._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar91._8_8_ = -(ulong)(ptr_02 == (__m128i *)0x0);
            auVar57 = packssdw(auVar77,auVar91);
            auVar37 = packssdw(auVar37,auVar57);
            if (((((b_02 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) && b_03 != (__m128i *)0x0)
                 && b_04 != (__m128i *)0x0) && ptr_04 != (int16_t *)0x0) &&
                ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar37 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar37 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar37 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar37 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar37 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar37 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar37 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar37 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar37 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar37[0xf])) {
              iVar17 = s2Len + -1;
              auVar37 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar34 = auVar37._0_4_;
              auVar37 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar35 = auVar37._0_4_;
              auVar37 = pshuflw(ZEXT416(iVar26 - 0x7fff),ZEXT416(iVar26 - 0x7fff),0);
              local_b8 = auVar37._0_2_;
              uStack_b6 = auVar37._2_2_;
              auVar57 = ZEXT416(CONCAT22((short)((uint)iVar21 >> 0x10),0x7ffe - (short)iVar123));
              auVar57 = pshuflw(auVar57,auVar57,0);
              c[0] = uVar31;
              parasail_memset___m128i(b,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = uVar31;
              parasail_memset___m128i(b_00,c_00,len);
              c_01[1] = extraout_RDX_01;
              c_01[0] = uVar31;
              parasail_memset___m128i(b_01,c_01,len);
              c_02[1] = extraout_RDX_02;
              c_02[0] = uVar31;
              parasail_memset___m128i(b_02,c_02,len);
              c_03[1] = extraout_RDX_03;
              c_03[0] = uVar31;
              parasail_memset___m128i(b_03,c_03,len);
              c_04[1] = extraout_RDX_04;
              c_04[0] = uVar31;
              parasail_memset___m128i(b_04,c_04,len);
              lVar22 = (long)iVar29;
              uVar24 = 0;
              do {
                lVar27 = 0;
                lVar25 = lVar22;
                do {
                  uVar30 = 0x8000;
                  if (-0x8000 < lVar25) {
                    uVar30 = (undefined2)lVar25;
                  }
                  *(undefined2 *)((long)&local_48 + lVar27 * 2) = uVar30;
                  lVar32 = lVar25 - (ulong)(uint)open;
                  if (lVar32 < -0x7fff) {
                    lVar32 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar27 * 2) = (short)lVar32;
                  lVar27 = lVar27 + 1;
                  lVar25 = lVar25 - uVar31 * (uint)gap;
                } while (lVar27 != 8);
                palVar20[uVar24][0] = local_48;
                palVar20[uVar24][1] = lStack_40;
                ptr_03[uVar24][0] = local_58;
                ptr_03[uVar24][1] = lStack_50;
                uVar24 = uVar24 + 1;
                lVar22 = lVar22 - (ulong)(uint)gap;
              } while (uVar24 != uVar31);
              *ptr_04 = 0;
              auVar101 = _DAT_00906ca0;
              lVar22 = (ulong)(uint)s2Len - 1;
              auVar38._8_4_ = (int)lVar22;
              auVar38._0_8_ = lVar22;
              auVar38._12_4_ = (int)((ulong)lVar22 >> 0x20);
              auVar117._4_4_ = gap;
              auVar117._0_4_ = gap;
              auVar117._8_4_ = gap;
              auVar117._12_4_ = gap;
              iVar21 = -gap;
              iVar26 = 0;
              auVar77 = pmovsxbq(auVar76,0x504);
              auVar91 = pmovsxbq(in_XMM5,0x302);
              auVar76 = pmovsxbq(in_XMM6,0x100);
              auVar38 = auVar38 ^ _DAT_00906ca0;
              auVar118._8_4_ = 0xffffffff;
              auVar118._0_8_ = 0xffffffffffffffff;
              auVar118._12_4_ = 0xffffffff;
              auVar102 = pmovsxbd(in_XMM9,0x7060504);
              auVar105 = pmovsxwd(in_XMM10,0x8000800080008000);
              uVar24 = 0;
              do {
                uVar114 = (undefined4)uVar24;
                auVar115._8_4_ = uVar114;
                auVar115._0_8_ = uVar24;
                auVar115._12_4_ = (int)(uVar24 >> 0x20);
                auVar124 = (auVar115 | auVar76) ^ auVar101;
                lVar22 = auVar38._0_8_;
                auVar125._0_8_ = -(ulong)(lVar22 < auVar124._0_8_);
                lVar25 = auVar38._8_8_;
                auVar125._8_8_ = -(ulong)(lVar25 < auVar124._8_8_);
                auVar124 = pshuflw(in_XMM15,auVar125,0xe8);
                in_XMM15 = packssdw(auVar124 ^ auVar118,auVar124 ^ auVar118);
                iVar122 = gap * 2 + iVar26;
                iVar123 = gap * 3 + iVar26;
                auVar124._4_4_ = open;
                auVar124._0_4_ = iVar26;
                auVar124._12_4_ = iVar123;
                auVar124._8_4_ = iVar122;
                iVar119 = iVar29 - iVar26;
                iVar121 = iVar21 - open;
                iVar122 = iVar29 - iVar122;
                iVar123 = iVar29 - iVar123;
                iVar7 = auVar105._0_4_;
                iVar8 = auVar105._4_4_;
                iVar9 = auVar105._8_4_;
                iVar10 = auVar105._12_4_;
                if ((in_XMM15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 1] =
                       (ushort)(iVar119 < iVar7) * auVar105._0_2_ |
                       (ushort)(iVar119 >= iVar7) * (short)iVar119;
                }
                auVar125 = packssdw(auVar125,auVar125);
                auVar125 = packssdw(auVar125 ^ auVar118,auVar125 ^ auVar118);
                if ((auVar125 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 2] =
                       (ushort)(iVar121 < iVar8) * auVar105._4_2_ |
                       (ushort)(iVar121 >= iVar8) * (short)iVar121;
                }
                auVar125 = (auVar115 | auVar91) ^ auVar101;
                auVar126._0_8_ = -(ulong)(lVar22 < auVar125._0_8_);
                auVar126._8_8_ = -(ulong)(lVar25 < auVar125._8_8_);
                auVar124 = packssdw(auVar124,auVar126);
                auVar124 = packssdw(auVar124 ^ auVar118,auVar124 ^ auVar118);
                if ((auVar124 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 3] =
                       (ushort)(iVar122 < iVar9) * auVar105._8_2_ |
                       (ushort)(iVar122 >= iVar9) * (short)iVar122;
                }
                auVar124 = pshufhw(auVar124,auVar126,0x84);
                auVar124 = packssdw(auVar124 ^ auVar118,auVar124 ^ auVar118);
                if ((auVar124 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 4] =
                       (ushort)(iVar123 < iVar10) * auVar105._12_2_ |
                       (ushort)(iVar123 >= iVar10) * (short)iVar123;
                }
                auVar64._4_4_ = uVar114;
                auVar64._0_4_ = uVar114;
                auVar64._8_4_ = uVar114;
                auVar64._12_4_ = uVar114;
                auVar124 = pmulld(auVar64 | auVar102,auVar117);
                iVar123 = iVar29 - auVar124._0_4_;
                iVar122 = iVar29 - auVar124._4_4_;
                iVar119 = iVar29 - auVar124._8_4_;
                iVar121 = iVar29 - auVar124._12_4_;
                auVar125 = (auVar115 | auVar77) ^ auVar101;
                auVar120._0_8_ = -(ulong)(lVar22 < auVar125._0_8_);
                auVar120._8_8_ = -(ulong)(lVar25 < auVar125._8_8_);
                auVar124 = pshuflw(auVar124,auVar120,0xe8);
                auVar124 = packssdw(auVar124 ^ auVar118,auVar124 ^ auVar118);
                if ((auVar124 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 5] =
                       (ushort)(iVar123 < iVar7) * auVar105._0_2_ |
                       (ushort)(iVar123 >= iVar7) * (short)iVar123;
                }
                auVar125 = packssdw(auVar120,auVar120);
                auVar124 = packssdw(auVar124,auVar125 ^ auVar118);
                if ((auVar124 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 6] =
                       (ushort)(iVar122 < iVar8) * auVar105._4_2_ |
                       (ushort)(iVar122 >= iVar8) * (short)iVar122;
                }
                auVar115 = (auVar115 | _DAT_00903ac0) ^ auVar101;
                auVar116._0_8_ = -(ulong)(lVar22 < auVar115._0_8_);
                auVar116._8_8_ = -(ulong)(lVar25 < auVar115._8_8_);
                auVar124 = packssdw(auVar124,auVar116);
                auVar124 = packssdw(auVar124 ^ auVar118,auVar124 ^ auVar118);
                if ((auVar124 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 7] =
                       (ushort)(iVar119 < iVar9) * auVar105._8_2_ |
                       (ushort)(iVar119 >= iVar9) * (short)iVar119;
                }
                auVar124 = pshufhw(auVar124,auVar116,0x84);
                auVar124 = packssdw(auVar124 ^ auVar118,auVar124 ^ auVar118);
                if ((auVar124 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_04[uVar24 + 8] =
                       (ushort)(iVar121 < iVar10) * auVar105._12_2_ |
                       (ushort)(iVar121 >= iVar10) * (short)iVar121;
                }
                uVar24 = uVar24 + 8;
                iVar21 = iVar21 + gap * -8;
                iVar26 = iVar26 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar24);
              uVar18 = (int)uVar31 - 1;
              uVar24 = 0;
              local_88 = auVar57._0_2_;
              uStack_86 = auVar57._2_2_;
              uVar75 = local_b8;
              uVar79 = uStack_b6;
              uVar81 = local_b8;
              uVar82 = uStack_b6;
              uVar84 = local_b8;
              uVar85 = uStack_b6;
              uVar87 = local_b8;
              uVar88 = uStack_b6;
              uVar62 = local_88;
              uVar41 = uStack_86;
              uVar66 = local_88;
              uVar44 = uStack_86;
              uStack_140 = local_88;
              uStack_13e = uStack_86;
              uStack_13c = local_88;
              uStack_13a = uStack_86;
              do {
                local_160 = ptr_00;
                local_188 = ptr_01;
                local_190 = ptr_02;
                ptr_05 = ptr;
                ptr_00 = b;
                ptr_02 = b_01;
                ptr_01 = b_00;
                ptr = palVar20;
                _local_148 = CONCAT22(uVar41,uVar62);
                _local_148 = CONCAT24(uVar66,_local_148);
                _local_148 = CONCAT26(uVar44,_local_148);
                uVar55 = ptr[uVar18][0];
                uVar47 = ptr_00[uVar18][0];
                uVar63 = ptr_01[uVar18][0];
                uVar56 = ptr_02[uVar18][0];
                auVar102._0_8_ = uVar47 << 0x10;
                auVar102._8_8_ = ptr_00[uVar18][1] << 0x10 | uVar47 >> 0x30;
                auVar105._0_8_ = uVar63 << 0x10;
                auVar105._8_8_ = ptr_01[uVar18][1] << 0x10 | uVar63 >> 0x30;
                auVar106._0_8_ = uVar56 << 0x10;
                auVar106._8_8_ = ptr_02[uVar18][1] << 0x10 | uVar56 >> 0x30;
                auVar76._8_8_ = ptr[uVar18][1] << 0x10 | uVar55 >> 0x30;
                auVar76._0_8_ = uVar55 << 0x10 | (ulong)(ushort)ptr_04[uVar24];
                lVar22 = (long)ppVar4->mapper[(byte)s2[uVar24]] * uVar31 * 0x10;
                auVar100 = (undefined1  [16])0x0;
                lVar25 = 0;
                auVar101 = pmovsxbw(auVar101,0x101010101010101);
                local_158 = (undefined1  [16])0x0;
                auVar103._4_2_ = local_b8;
                auVar103._0_4_ = auVar37._0_4_;
                auVar103._6_2_ = uStack_b6;
                auVar103._8_2_ = local_b8;
                auVar103._10_2_ = uStack_b6;
                auVar103._12_2_ = local_b8;
                auVar103._14_2_ = uStack_b6;
                do {
                  auVar57 = *(undefined1 (*) [16])((long)*ptr_03 + lVar25);
                  auVar77 = *(undefined1 (*) [16])((long)*b_02 + lVar25);
                  auVar91 = *(undefined1 (*) [16])((long)*b_03 + lVar25);
                  auVar38 = *(undefined1 (*) [16])((long)*b_04 + lVar25);
                  auVar76 = paddsw(auVar76,*(undefined1 (*) [16])((long)pvVar3 + lVar25 + lVar22));
                  sVar16 = auVar57._0_2_;
                  uVar41 = auVar76._0_2_;
                  uVar62 = (ushort)((short)uVar41 < sVar16) * sVar16 |
                           ((short)uVar41 >= sVar16) * uVar41;
                  sVar16 = auVar57._2_2_;
                  uVar44 = auVar76._2_2_;
                  uVar66 = (ushort)((short)uVar44 < sVar16) * sVar16 |
                           ((short)uVar44 >= sVar16) * uVar44;
                  sVar16 = auVar57._4_2_;
                  uVar80 = auVar76._4_2_;
                  uVar67 = (ushort)((short)uVar80 < sVar16) * sVar16 |
                           ((short)uVar80 >= sVar16) * uVar80;
                  sVar16 = auVar57._6_2_;
                  uVar83 = auVar76._6_2_;
                  uVar68 = (ushort)((short)uVar83 < sVar16) * sVar16 |
                           ((short)uVar83 >= sVar16) * uVar83;
                  sVar16 = auVar57._8_2_;
                  uVar86 = auVar76._8_2_;
                  uVar69 = (ushort)((short)uVar86 < sVar16) * sVar16 |
                           ((short)uVar86 >= sVar16) * uVar86;
                  sVar16 = auVar57._10_2_;
                  uVar89 = auVar76._10_2_;
                  uVar70 = (ushort)((short)uVar89 < sVar16) * sVar16 |
                           ((short)uVar89 >= sVar16) * uVar89;
                  sVar16 = auVar57._12_2_;
                  uVar72 = auVar76._12_2_;
                  uVar74 = auVar76._14_2_;
                  uVar71 = (ushort)((short)uVar72 < sVar16) * sVar16 |
                           ((short)uVar72 >= sVar16) * uVar72;
                  sVar16 = auVar57._14_2_;
                  uVar73 = (ushort)((short)uVar74 < sVar16) * sVar16 |
                           ((short)uVar74 >= sVar16) * uVar74;
                  sVar16 = auVar103._0_2_;
                  auVar58._0_2_ =
                       (ushort)((short)uVar62 < sVar16) * sVar16 |
                       ((short)uVar62 >= sVar16) * uVar62;
                  sVar33 = auVar103._2_2_;
                  auVar58._2_2_ =
                       (ushort)((short)uVar66 < sVar33) * sVar33 |
                       ((short)uVar66 >= sVar33) * uVar66;
                  sVar42 = auVar103._4_2_;
                  auVar58._4_2_ =
                       (ushort)((short)uVar67 < sVar42) * sVar42 |
                       ((short)uVar67 >= sVar42) * uVar67;
                  sVar43 = auVar103._6_2_;
                  auVar58._6_2_ =
                       (ushort)((short)uVar68 < sVar43) * sVar43 |
                       ((short)uVar68 >= sVar43) * uVar68;
                  sVar45 = auVar103._8_2_;
                  auVar58._8_2_ =
                       (ushort)((short)uVar69 < sVar45) * sVar45 |
                       ((short)uVar69 >= sVar45) * uVar69;
                  sVar46 = auVar103._10_2_;
                  auVar58._10_2_ =
                       (ushort)((short)uVar70 < sVar46) * sVar46 |
                       ((short)uVar70 >= sVar46) * uVar70;
                  sVar48 = auVar103._12_2_;
                  auVar58._12_2_ =
                       (ushort)((short)uVar71 < sVar48) * sVar48 |
                       ((short)uVar71 >= sVar48) * uVar71;
                  sVar49 = auVar103._14_2_;
                  auVar58._14_2_ =
                       (ushort)((short)uVar73 < sVar49) * sVar49 |
                       ((short)uVar73 >= sVar49) * uVar73;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar25) = auVar58;
                  auVar65._0_2_ = -(ushort)(sVar16 < (short)uVar62);
                  auVar65._2_2_ = -(ushort)(sVar33 < (short)uVar66);
                  auVar65._4_2_ = -(ushort)(sVar42 < (short)uVar67);
                  auVar65._6_2_ = -(ushort)(sVar43 < (short)uVar68);
                  auVar65._8_2_ = -(ushort)(sVar45 < (short)uVar69);
                  auVar65._10_2_ = -(ushort)(sVar46 < (short)uVar70);
                  auVar65._12_2_ = -(ushort)(sVar48 < (short)uVar71);
                  auVar65._14_2_ = -(ushort)(sVar49 < (short)uVar73);
                  auVar76 = pblendvb(local_158,auVar77,auVar65);
                  auVar117 = paddsw(auVar102,*(undefined1 (*) [16])((long)pvVar5 + lVar25 + lVar22))
                  ;
                  auVar52._0_2_ = -(ushort)(uVar41 == auVar58._0_2_);
                  auVar52._2_2_ = -(ushort)(uVar44 == auVar58._2_2_);
                  auVar52._4_2_ = -(ushort)(uVar80 == auVar58._4_2_);
                  auVar52._6_2_ = -(ushort)(uVar83 == auVar58._6_2_);
                  auVar52._8_2_ = -(ushort)(uVar86 == auVar58._8_2_);
                  auVar52._10_2_ = -(ushort)(uVar89 == auVar58._10_2_);
                  auVar52._12_2_ = -(ushort)(uVar72 == auVar58._12_2_);
                  auVar52._14_2_ = -(ushort)(uVar74 == auVar58._14_2_);
                  auVar117 = pblendvb(auVar76,auVar117,auVar52);
                  *(undefined1 (*) [16])((long)*local_160 + lVar25) = auVar117;
                  auVar118 = pblendvb(auVar100,auVar91,auVar65);
                  auVar76 = paddsw(auVar105,*(undefined1 (*) [16])((long)pvVar6 + lVar25 + lVar22));
                  auVar102 = pblendvb(auVar118,auVar76,auVar52);
                  *(undefined1 (*) [16])((long)*local_188 + lVar25) = auVar102;
                  auVar118 = pblendvb(auVar101,auVar38,auVar65);
                  auVar76 = pmovsxbw(auVar65,0x101010101010101);
                  auVar76 = paddsw(auVar106,auVar76);
                  auVar118 = pblendvb(auVar118,auVar76,auVar52);
                  *(undefined1 (*) [16])((long)*local_190 + lVar25) = auVar118;
                  uVar62 = ((short)auVar58._0_2_ < (short)local_148) * auVar58._0_2_ |
                           ((short)auVar58._0_2_ >= (short)local_148) * local_148;
                  uVar41 = ((short)auVar58._2_2_ < (short)uStack_146) * auVar58._2_2_ |
                           ((short)auVar58._2_2_ >= (short)uStack_146) * uStack_146;
                  uVar66 = ((short)auVar58._4_2_ < (short)uStack_144) * auVar58._4_2_ |
                           ((short)auVar58._4_2_ >= (short)uStack_144) * uStack_144;
                  uVar44 = ((short)auVar58._6_2_ < (short)uStack_142) * auVar58._6_2_ |
                           ((short)auVar58._6_2_ >= (short)uStack_142) * uStack_142;
                  uStack_140 = ((short)auVar58._8_2_ < (short)uStack_140) * auVar58._8_2_ |
                               ((short)auVar58._8_2_ >= (short)uStack_140) * uStack_140;
                  uStack_13e = ((short)auVar58._10_2_ < (short)uStack_13e) * auVar58._10_2_ |
                               ((short)auVar58._10_2_ >= (short)uStack_13e) * uStack_13e;
                  uStack_13c = ((short)auVar58._12_2_ < (short)uStack_13c) * auVar58._12_2_ |
                               ((short)auVar58._12_2_ >= (short)uStack_13c) * uStack_13c;
                  uStack_13a = ((short)auVar58._14_2_ < (short)uStack_13a) * auVar58._14_2_ |
                               ((short)auVar58._14_2_ >= (short)uStack_13a) * uStack_13a;
                  _local_148 = CONCAT22(uVar41,uVar62);
                  _local_148 = CONCAT24(uVar66,_local_148);
                  _local_148 = CONCAT26(uVar44,_local_148);
                  uVar75 = ((short)uVar75 < (short)auVar58._0_2_) * auVar58._0_2_ |
                           ((short)uVar75 >= (short)auVar58._0_2_) * uVar75;
                  uVar79 = ((short)uVar79 < (short)auVar58._2_2_) * auVar58._2_2_ |
                           ((short)uVar79 >= (short)auVar58._2_2_) * uVar79;
                  uVar81 = ((short)uVar81 < (short)auVar58._4_2_) * auVar58._4_2_ |
                           ((short)uVar81 >= (short)auVar58._4_2_) * uVar81;
                  uVar82 = ((short)uVar82 < (short)auVar58._6_2_) * auVar58._6_2_ |
                           ((short)uVar82 >= (short)auVar58._6_2_) * uVar82;
                  uVar84 = ((short)uVar84 < (short)auVar58._8_2_) * auVar58._8_2_ |
                           ((short)uVar84 >= (short)auVar58._8_2_) * uVar84;
                  uVar85 = ((short)uVar85 < (short)auVar58._10_2_) * auVar58._10_2_ |
                           ((short)uVar85 >= (short)auVar58._10_2_) * uVar85;
                  uVar87 = ((short)uVar87 < (short)auVar58._12_2_) * auVar58._12_2_ |
                           ((short)uVar87 >= (short)auVar58._12_2_) * uVar87;
                  uVar88 = ((short)uVar88 < (short)auVar58._14_2_) * auVar58._14_2_ |
                           ((short)uVar88 >= (short)auVar58._14_2_) * uVar88;
                  sVar16 = auVar118._0_2_;
                  sVar33 = auVar102._0_2_;
                  uVar67 = (ushort)(sVar33 < sVar16) * sVar16 | (ushort)(sVar33 >= sVar16) * sVar33;
                  sVar16 = auVar118._2_2_;
                  sVar33 = auVar102._2_2_;
                  uVar80 = (ushort)(sVar33 < sVar16) * sVar16 | (ushort)(sVar33 >= sVar16) * sVar33;
                  sVar16 = auVar118._4_2_;
                  sVar33 = auVar102._4_2_;
                  uVar68 = (ushort)(sVar33 < sVar16) * sVar16 | (ushort)(sVar33 >= sVar16) * sVar33;
                  sVar16 = auVar118._6_2_;
                  sVar33 = auVar102._6_2_;
                  uVar83 = (ushort)(sVar33 < sVar16) * sVar16 | (ushort)(sVar33 >= sVar16) * sVar33;
                  sVar16 = auVar118._8_2_;
                  sVar33 = auVar102._8_2_;
                  uVar69 = (ushort)(sVar33 < sVar16) * sVar16 | (ushort)(sVar33 >= sVar16) * sVar33;
                  sVar16 = auVar118._10_2_;
                  sVar33 = auVar102._10_2_;
                  uVar86 = (ushort)(sVar33 < sVar16) * sVar16 | (ushort)(sVar33 >= sVar16) * sVar33;
                  sVar16 = auVar118._12_2_;
                  sVar33 = auVar102._12_2_;
                  sVar42 = auVar102._14_2_;
                  uVar70 = (ushort)(sVar33 < sVar16) * sVar16 | (ushort)(sVar33 >= sVar16) * sVar33;
                  sVar16 = auVar118._14_2_;
                  uVar89 = (ushort)(sVar42 < sVar16) * sVar16 | (ushort)(sVar42 >= sVar16) * sVar42;
                  auVar14._4_4_ = uVar34;
                  auVar14._0_4_ = uVar34;
                  auVar14._8_4_ = uVar34;
                  auVar14._12_4_ = uVar34;
                  auVar76 = psubsw(auVar58,auVar14);
                  auVar12._4_4_ = uVar35;
                  auVar12._0_4_ = uVar35;
                  auVar12._8_4_ = uVar35;
                  auVar12._12_4_ = uVar35;
                  auVar57 = psubsw(auVar57,auVar12);
                  sVar33 = auVar76._0_2_;
                  sVar90 = auVar57._0_2_;
                  auVar39._0_2_ = -(ushort)(sVar90 < sVar33);
                  sVar42 = auVar76._2_2_;
                  sVar93 = auVar57._2_2_;
                  auVar39._2_2_ = -(ushort)(sVar93 < sVar42);
                  sVar43 = auVar76._4_2_;
                  sVar94 = auVar57._4_2_;
                  auVar39._4_2_ = -(ushort)(sVar94 < sVar43);
                  sVar45 = auVar76._6_2_;
                  sVar95 = auVar57._6_2_;
                  auVar39._6_2_ = -(ushort)(sVar95 < sVar45);
                  sVar46 = auVar76._8_2_;
                  sVar96 = auVar57._8_2_;
                  auVar39._8_2_ = -(ushort)(sVar96 < sVar46);
                  sVar48 = auVar76._10_2_;
                  sVar97 = auVar57._10_2_;
                  auVar39._10_2_ = -(ushort)(sVar97 < sVar48);
                  sVar49 = auVar76._12_2_;
                  sVar98 = auVar57._12_2_;
                  sVar50 = auVar76._14_2_;
                  auVar39._12_2_ = -(ushort)(sVar98 < sVar49);
                  sVar99 = auVar57._14_2_;
                  auVar39._14_2_ = -(ushort)(sVar99 < sVar50);
                  auVar76 = pblendvb(auVar77,auVar117,auVar39);
                  auVar91 = pblendvb(auVar91,auVar102,auVar39);
                  auVar57 = pmovsxbw(auVar57,0x101010101010101);
                  auVar38 = paddsw(auVar38,auVar57);
                  auVar77 = paddsw(auVar118,auVar57);
                  auVar38 = pblendvb(auVar38,auVar77,auVar39);
                  auVar57 = psubsw(auVar103,auVar12);
                  sVar104 = auVar57._0_2_;
                  auVar59._0_2_ = -(ushort)(sVar104 < sVar33);
                  sVar107 = auVar57._2_2_;
                  auVar59._2_2_ = -(ushort)(sVar107 < sVar42);
                  sVar108 = auVar57._4_2_;
                  auVar59._4_2_ = -(ushort)(sVar108 < sVar43);
                  sVar109 = auVar57._6_2_;
                  auVar59._6_2_ = -(ushort)(sVar109 < sVar45);
                  sVar110 = auVar57._8_2_;
                  auVar59._8_2_ = -(ushort)(sVar110 < sVar46);
                  sVar111 = auVar57._10_2_;
                  auVar59._10_2_ = -(ushort)(sVar111 < sVar48);
                  sVar112 = auVar57._12_2_;
                  auVar59._12_2_ = -(ushort)(sVar112 < sVar49);
                  sVar113 = auVar57._14_2_;
                  auVar59._14_2_ = -(ushort)(sVar113 < sVar50);
                  local_158 = pblendvb(local_158,auVar117,auVar59);
                  sVar16 = auVar117._0_2_;
                  uVar75 = (ushort)((short)uVar75 < sVar16) * sVar16 |
                           ((short)uVar75 >= sVar16) * uVar75;
                  sVar16 = auVar117._2_2_;
                  uVar79 = (ushort)((short)uVar79 < sVar16) * sVar16 |
                           ((short)uVar79 >= sVar16) * uVar79;
                  sVar16 = auVar117._4_2_;
                  uVar81 = (ushort)((short)uVar81 < sVar16) * sVar16 |
                           ((short)uVar81 >= sVar16) * uVar81;
                  sVar16 = auVar117._6_2_;
                  uVar82 = (ushort)((short)uVar82 < sVar16) * sVar16 |
                           ((short)uVar82 >= sVar16) * uVar82;
                  sVar16 = auVar117._8_2_;
                  uVar84 = (ushort)((short)uVar84 < sVar16) * sVar16 |
                           ((short)uVar84 >= sVar16) * uVar84;
                  sVar16 = auVar117._10_2_;
                  uVar85 = (ushort)((short)uVar85 < sVar16) * sVar16 |
                           ((short)uVar85 >= sVar16) * uVar85;
                  sVar16 = auVar117._12_2_;
                  uVar87 = (ushort)((short)uVar87 < sVar16) * sVar16 |
                           ((short)uVar87 >= sVar16) * uVar87;
                  sVar16 = auVar117._14_2_;
                  uVar88 = (ushort)((short)uVar88 < sVar16) * sVar16 |
                           ((short)uVar88 >= sVar16) * uVar88;
                  uVar75 = ((short)uVar67 < (short)uVar75) * uVar75 |
                           ((short)uVar67 >= (short)uVar75) * uVar67;
                  uVar79 = ((short)uVar80 < (short)uVar79) * uVar79 |
                           ((short)uVar80 >= (short)uVar79) * uVar80;
                  uVar81 = ((short)uVar68 < (short)uVar81) * uVar81 |
                           ((short)uVar68 >= (short)uVar81) * uVar68;
                  uVar82 = ((short)uVar83 < (short)uVar82) * uVar82 |
                           ((short)uVar83 >= (short)uVar82) * uVar83;
                  uVar84 = ((short)uVar69 < (short)uVar84) * uVar84 |
                           ((short)uVar69 >= (short)uVar84) * uVar69;
                  uVar85 = ((short)uVar86 < (short)uVar85) * uVar85 |
                           ((short)uVar86 >= (short)uVar85) * uVar86;
                  uVar87 = ((short)uVar70 < (short)uVar87) * uVar87 |
                           ((short)uVar70 >= (short)uVar87) * uVar70;
                  uVar88 = ((short)uVar89 < (short)uVar88) * uVar88 |
                           ((short)uVar89 >= (short)uVar88) * uVar89;
                  puVar1 = (ushort *)((long)*ptr_03 + lVar25);
                  *puVar1 = (ushort)(sVar33 < sVar90) * sVar90 | (ushort)(sVar33 >= sVar90) * sVar33
                  ;
                  puVar1[1] = (ushort)(sVar42 < sVar93) * sVar93 |
                              (ushort)(sVar42 >= sVar93) * sVar42;
                  puVar1[2] = (ushort)(sVar43 < sVar94) * sVar94 |
                              (ushort)(sVar43 >= sVar94) * sVar43;
                  puVar1[3] = (ushort)(sVar45 < sVar95) * sVar95 |
                              (ushort)(sVar45 >= sVar95) * sVar45;
                  puVar1[4] = (ushort)(sVar46 < sVar96) * sVar96 |
                              (ushort)(sVar46 >= sVar96) * sVar46;
                  puVar1[5] = (ushort)(sVar48 < sVar97) * sVar97 |
                              (ushort)(sVar48 >= sVar97) * sVar48;
                  puVar1[6] = (ushort)(sVar49 < sVar98) * sVar98 |
                              (ushort)(sVar49 >= sVar98) * sVar49;
                  puVar1[7] = (ushort)(sVar50 < sVar99) * sVar99 |
                              (ushort)(sVar50 >= sVar99) * sVar50;
                  *(undefined1 (*) [16])((long)*b_02 + lVar25) = auVar76;
                  *(undefined1 (*) [16])((long)*b_03 + lVar25) = auVar91;
                  *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar38;
                  auVar103._0_2_ =
                       (ushort)(sVar33 < sVar104) * sVar104 | (ushort)(sVar33 >= sVar104) * sVar33;
                  auVar103._2_2_ =
                       (ushort)(sVar42 < sVar107) * sVar107 | (ushort)(sVar42 >= sVar107) * sVar42;
                  auVar103._4_2_ =
                       (ushort)(sVar43 < sVar108) * sVar108 | (ushort)(sVar43 >= sVar108) * sVar43;
                  auVar103._6_2_ =
                       (ushort)(sVar45 < sVar109) * sVar109 | (ushort)(sVar45 >= sVar109) * sVar45;
                  auVar103._8_2_ =
                       (ushort)(sVar46 < sVar110) * sVar110 | (ushort)(sVar46 >= sVar110) * sVar46;
                  auVar103._10_2_ =
                       (ushort)(sVar48 < sVar111) * sVar111 | (ushort)(sVar48 >= sVar111) * sVar48;
                  auVar103._12_2_ =
                       (ushort)(sVar49 < sVar112) * sVar112 | (ushort)(sVar49 >= sVar112) * sVar49;
                  auVar103._14_2_ =
                       (ushort)(sVar50 < sVar113) * sVar113 | (ushort)(sVar50 >= sVar113) * sVar50;
                  auVar100 = pblendvb(auVar100,auVar102,auVar59);
                  auVar57 = paddsw(auVar101,_DAT_00904d10);
                  auVar101 = pblendvb(auVar57,auVar77,auVar59);
                  auVar76 = *(undefined1 (*) [16])((long)*ptr + lVar25);
                  auVar102 = *(undefined1 (*) [16])((long)*ptr_00 + lVar25);
                  auVar105 = *(undefined1 (*) [16])((long)*ptr_01 + lVar25);
                  auVar106 = *(undefined1 (*) [16])((long)*ptr_02 + lVar25);
                  lVar25 = lVar25 + 0x10;
                } while (uVar31 << 4 != lVar25);
                iVar21 = 0;
                auVar15._4_4_ = uVar34;
                auVar15._0_4_ = uVar34;
                auVar15._8_4_ = uVar34;
                auVar15._12_4_ = uVar34;
                auVar13._4_4_ = uVar35;
                auVar13._0_4_ = uVar35;
                auVar13._8_4_ = uVar35;
                auVar13._12_4_ = uVar35;
                auVar57 = pmovsxbw(auVar105,0x101010101010101);
                do {
                  uVar11 = ptr_04[uVar24 + 1] - open;
                  if (ptr_04[uVar24 + 1] - open < -0x7fff) {
                    uVar11 = 0xffff8000;
                  }
                  uVar55 = ptr[uVar18][0];
                  auVar60._8_8_ = ptr[uVar18][1] << 0x10 | uVar55 >> 0x30;
                  auVar60._0_8_ = uVar55 << 0x10 | (ulong)(ushort)ptr_04[uVar24];
                  uVar55 = auVar103._0_8_;
                  auVar103._8_8_ = auVar103._8_8_ << 0x10 | uVar55 >> 0x30;
                  auVar103._0_8_ = uVar55 << 0x10 | (ulong)uVar11 & 0xffff;
                  uVar55 = auVar101._0_8_;
                  auVar101._8_8_ = auVar101._8_8_ << 0x10 | uVar55 >> 0x30;
                  auVar101._0_8_ = uVar55 << 0x10 | 1;
                  lVar25 = local_158._8_8_;
                  uVar55 = local_158._0_8_;
                  local_158._0_8_ = uVar55 << 0x10;
                  local_158._8_8_ = lVar25 << 0x10 | uVar55 >> 0x30;
                  lVar25 = auVar100._8_8_;
                  uVar55 = auVar100._0_8_;
                  auVar100._0_8_ = uVar55 << 0x10;
                  auVar100._8_8_ = lVar25 << 0x10 | uVar55 >> 0x30;
                  lVar25 = 0;
                  do {
                    auVar77 = paddsw(auVar60,*(undefined1 (*) [16])((long)pvVar3 + lVar25 + lVar22))
                    ;
                    psVar2 = (short *)((long)*ptr_05 + lVar25);
                    sVar50 = *psVar2;
                    sVar90 = psVar2[1];
                    sVar93 = psVar2[2];
                    sVar94 = psVar2[3];
                    sVar95 = psVar2[4];
                    sVar96 = psVar2[5];
                    sVar97 = psVar2[6];
                    sVar98 = psVar2[7];
                    sVar16 = auVar103._0_2_;
                    auVar53._0_2_ =
                         (ushort)(sVar50 < sVar16) * sVar16 | (ushort)(sVar50 >= sVar16) * sVar50;
                    sVar33 = auVar103._2_2_;
                    auVar53._2_2_ =
                         (ushort)(sVar90 < sVar33) * sVar33 | (ushort)(sVar90 >= sVar33) * sVar90;
                    sVar42 = auVar103._4_2_;
                    auVar53._4_2_ =
                         (ushort)(sVar93 < sVar42) * sVar42 | (ushort)(sVar93 >= sVar42) * sVar93;
                    sVar43 = auVar103._6_2_;
                    auVar53._6_2_ =
                         (ushort)(sVar94 < sVar43) * sVar43 | (ushort)(sVar94 >= sVar43) * sVar94;
                    sVar45 = auVar103._8_2_;
                    auVar53._8_2_ =
                         (ushort)(sVar95 < sVar45) * sVar45 | (ushort)(sVar95 >= sVar45) * sVar95;
                    sVar46 = auVar103._10_2_;
                    auVar53._10_2_ =
                         (ushort)(sVar96 < sVar46) * sVar46 | (ushort)(sVar96 >= sVar46) * sVar96;
                    sVar48 = auVar103._12_2_;
                    auVar53._12_2_ =
                         (ushort)(sVar97 < sVar48) * sVar48 | (ushort)(sVar97 >= sVar48) * sVar97;
                    sVar49 = auVar103._14_2_;
                    auVar53._14_2_ =
                         (ushort)(sVar98 < sVar49) * sVar49 | (ushort)(sVar98 >= sVar49) * sVar98;
                    *(undefined1 (*) [16])((long)*ptr_05 + lVar25) = auVar53;
                    auVar61._0_2_ = -(ushort)(auVar77._0_2_ == auVar53._0_2_);
                    auVar61._2_2_ = -(ushort)(auVar77._2_2_ == auVar53._2_2_);
                    auVar61._4_2_ = -(ushort)(auVar77._4_2_ == auVar53._4_2_);
                    auVar61._6_2_ = -(ushort)(auVar77._6_2_ == auVar53._6_2_);
                    auVar61._8_2_ = -(ushort)(auVar77._8_2_ == auVar53._8_2_);
                    auVar61._10_2_ = -(ushort)(auVar77._10_2_ == auVar53._10_2_);
                    auVar61._12_2_ = -(ushort)(auVar77._12_2_ == auVar53._12_2_);
                    auVar61._14_2_ = -(ushort)(auVar77._14_2_ == auVar53._14_2_);
                    auVar40._0_2_ = -(ushort)(sVar16 < sVar50);
                    auVar40._2_2_ = -(ushort)(sVar33 < sVar90);
                    auVar40._4_2_ = -(ushort)(sVar42 < sVar93);
                    auVar40._6_2_ = -(ushort)(sVar43 < sVar94);
                    auVar40._8_2_ = -(ushort)(sVar45 < sVar95);
                    auVar40._10_2_ = -(ushort)(sVar46 < sVar96);
                    auVar40._12_2_ = -(ushort)(sVar48 < sVar97);
                    auVar40._14_2_ = -(ushort)(sVar49 < sVar98);
                    auVar40 = auVar40 | auVar61;
                    auVar91 = pblendvb(local_158,*(undefined1 (*) [16])((long)*local_160 + lVar25),
                                       auVar40);
                    *(undefined1 (*) [16])((long)*local_160 + lVar25) = auVar91;
                    auVar38 = pblendvb(auVar100,*(undefined1 (*) [16])((long)*local_188 + lVar25),
                                       auVar40);
                    *(undefined1 (*) [16])((long)*local_188 + lVar25) = auVar38;
                    auVar76 = pblendvb(auVar101,*(undefined1 (*) [16])((long)*local_190 + lVar25),
                                       auVar40);
                    *(undefined1 (*) [16])((long)*local_190 + lVar25) = auVar76;
                    uVar62 = ((short)auVar53._0_2_ < (short)uVar62) * auVar53._0_2_ |
                             ((short)auVar53._0_2_ >= (short)uVar62) * uVar62;
                    uVar41 = ((short)auVar53._2_2_ < (short)uVar41) * auVar53._2_2_ |
                             ((short)auVar53._2_2_ >= (short)uVar41) * uVar41;
                    uVar66 = ((short)auVar53._4_2_ < (short)uVar66) * auVar53._4_2_ |
                             ((short)auVar53._4_2_ >= (short)uVar66) * uVar66;
                    uVar44 = ((short)auVar53._6_2_ < (short)uVar44) * auVar53._6_2_ |
                             ((short)auVar53._6_2_ >= (short)uVar44) * uVar44;
                    uStack_140 = ((short)auVar53._8_2_ < (short)uStack_140) * auVar53._8_2_ |
                                 ((short)auVar53._8_2_ >= (short)uStack_140) * uStack_140;
                    uStack_13e = ((short)auVar53._10_2_ < (short)uStack_13e) * auVar53._10_2_ |
                                 ((short)auVar53._10_2_ >= (short)uStack_13e) * uStack_13e;
                    uStack_13c = ((short)auVar53._12_2_ < (short)uStack_13c) * auVar53._12_2_ |
                                 ((short)auVar53._12_2_ >= (short)uStack_13c) * uStack_13c;
                    uStack_13a = ((short)auVar53._14_2_ < (short)uStack_13a) * auVar53._14_2_ |
                                 ((short)auVar53._14_2_ >= (short)uStack_13a) * uStack_13a;
                    uVar75 = ((short)uVar75 < (short)auVar53._0_2_) * auVar53._0_2_ |
                             ((short)uVar75 >= (short)auVar53._0_2_) * uVar75;
                    uVar79 = ((short)uVar79 < (short)auVar53._2_2_) * auVar53._2_2_ |
                             ((short)uVar79 >= (short)auVar53._2_2_) * uVar79;
                    uVar81 = ((short)uVar81 < (short)auVar53._4_2_) * auVar53._4_2_ |
                             ((short)uVar81 >= (short)auVar53._4_2_) * uVar81;
                    uVar82 = ((short)uVar82 < (short)auVar53._6_2_) * auVar53._6_2_ |
                             ((short)uVar82 >= (short)auVar53._6_2_) * uVar82;
                    uVar84 = ((short)uVar84 < (short)auVar53._8_2_) * auVar53._8_2_ |
                             ((short)uVar84 >= (short)auVar53._8_2_) * uVar84;
                    uVar85 = ((short)uVar85 < (short)auVar53._10_2_) * auVar53._10_2_ |
                             ((short)uVar85 >= (short)auVar53._10_2_) * uVar85;
                    uVar87 = ((short)uVar87 < (short)auVar53._12_2_) * auVar53._12_2_ |
                             ((short)uVar87 >= (short)auVar53._12_2_) * uVar87;
                    uVar88 = ((short)uVar88 < (short)auVar53._14_2_) * auVar53._14_2_ |
                             ((short)uVar88 >= (short)auVar53._14_2_) * uVar88;
                    sVar16 = auVar91._0_2_;
                    uVar75 = (ushort)((short)uVar75 < sVar16) * sVar16 |
                             ((short)uVar75 >= sVar16) * uVar75;
                    sVar16 = auVar91._2_2_;
                    uVar79 = (ushort)((short)uVar79 < sVar16) * sVar16 |
                             ((short)uVar79 >= sVar16) * uVar79;
                    sVar16 = auVar91._4_2_;
                    uVar81 = (ushort)((short)uVar81 < sVar16) * sVar16 |
                             ((short)uVar81 >= sVar16) * uVar81;
                    sVar16 = auVar91._6_2_;
                    uVar82 = (ushort)((short)uVar82 < sVar16) * sVar16 |
                             ((short)uVar82 >= sVar16) * uVar82;
                    sVar16 = auVar91._8_2_;
                    uVar84 = (ushort)((short)uVar84 < sVar16) * sVar16 |
                             ((short)uVar84 >= sVar16) * uVar84;
                    sVar16 = auVar91._10_2_;
                    uVar85 = (ushort)((short)uVar85 < sVar16) * sVar16 |
                             ((short)uVar85 >= sVar16) * uVar85;
                    sVar16 = auVar91._12_2_;
                    uVar87 = (ushort)((short)uVar87 < sVar16) * sVar16 |
                             ((short)uVar87 >= sVar16) * uVar87;
                    sVar16 = auVar91._14_2_;
                    uVar88 = (ushort)((short)uVar88 < sVar16) * sVar16 |
                             ((short)uVar88 >= sVar16) * uVar88;
                    sVar16 = auVar76._0_2_;
                    sVar33 = auVar38._0_2_;
                    uVar67 = (ushort)(sVar33 < sVar16) * sVar16 |
                             (ushort)(sVar33 >= sVar16) * sVar33;
                    sVar16 = auVar76._2_2_;
                    sVar33 = auVar38._2_2_;
                    uVar80 = (ushort)(sVar33 < sVar16) * sVar16 |
                             (ushort)(sVar33 >= sVar16) * sVar33;
                    sVar16 = auVar76._4_2_;
                    sVar33 = auVar38._4_2_;
                    uVar68 = (ushort)(sVar33 < sVar16) * sVar16 |
                             (ushort)(sVar33 >= sVar16) * sVar33;
                    sVar16 = auVar76._6_2_;
                    sVar33 = auVar38._6_2_;
                    uVar83 = (ushort)(sVar33 < sVar16) * sVar16 |
                             (ushort)(sVar33 >= sVar16) * sVar33;
                    sVar16 = auVar76._8_2_;
                    sVar33 = auVar38._8_2_;
                    uVar69 = (ushort)(sVar33 < sVar16) * sVar16 |
                             (ushort)(sVar33 >= sVar16) * sVar33;
                    sVar16 = auVar76._10_2_;
                    sVar33 = auVar38._10_2_;
                    uVar86 = (ushort)(sVar33 < sVar16) * sVar16 |
                             (ushort)(sVar33 >= sVar16) * sVar33;
                    sVar16 = auVar76._12_2_;
                    sVar33 = auVar38._12_2_;
                    sVar42 = auVar38._14_2_;
                    uVar70 = (ushort)(sVar33 < sVar16) * sVar16 |
                             (ushort)(sVar33 >= sVar16) * sVar33;
                    sVar16 = auVar76._14_2_;
                    uVar89 = (ushort)(sVar42 < sVar16) * sVar16 |
                             (ushort)(sVar42 >= sVar16) * sVar42;
                    uVar75 = ((short)uVar67 < (short)uVar75) * uVar75 |
                             ((short)uVar67 >= (short)uVar75) * uVar67;
                    uVar79 = ((short)uVar80 < (short)uVar79) * uVar79 |
                             ((short)uVar80 >= (short)uVar79) * uVar80;
                    uVar81 = ((short)uVar68 < (short)uVar81) * uVar81 |
                             ((short)uVar68 >= (short)uVar81) * uVar68;
                    uVar82 = ((short)uVar83 < (short)uVar82) * uVar82 |
                             ((short)uVar83 >= (short)uVar82) * uVar83;
                    uVar84 = ((short)uVar69 < (short)uVar84) * uVar84 |
                             ((short)uVar69 >= (short)uVar84) * uVar69;
                    uVar85 = ((short)uVar86 < (short)uVar85) * uVar85 |
                             ((short)uVar86 >= (short)uVar85) * uVar86;
                    uVar87 = ((short)uVar70 < (short)uVar87) * uVar87 |
                             ((short)uVar70 >= (short)uVar87) * uVar70;
                    uVar88 = ((short)uVar89 < (short)uVar88) * uVar88 |
                             ((short)uVar89 >= (short)uVar88) * uVar89;
                    auVar77 = psubsw(auVar53,auVar15);
                    auVar103 = psubsw(auVar103,auVar13);
                    auVar54._0_2_ = -(ushort)(auVar103._0_2_ < auVar77._0_2_);
                    auVar54._2_2_ = -(ushort)(auVar103._2_2_ < auVar77._2_2_);
                    auVar54._4_2_ = -(ushort)(auVar103._4_2_ < auVar77._4_2_);
                    auVar54._6_2_ = -(ushort)(auVar103._6_2_ < auVar77._6_2_);
                    auVar54._8_2_ = -(ushort)(auVar103._8_2_ < auVar77._8_2_);
                    auVar54._10_2_ = -(ushort)(auVar103._10_2_ < auVar77._10_2_);
                    auVar54._12_2_ = -(ushort)(auVar103._12_2_ < auVar77._12_2_);
                    auVar54._14_2_ = -(ushort)(auVar103._14_2_ < auVar77._14_2_);
                    if ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(auVar54._14_2_ >> 7) & 1) << 0xe |
                                auVar54._14_2_ & 0x8000) == 0xffff) goto LAB_006ac076;
                    local_158 = pblendvb(local_158,auVar91,auVar54);
                    auVar100 = pblendvb(auVar100,auVar38,auVar54);
                    auVar91 = paddsw(auVar101,auVar57);
                    auVar77 = paddsw(auVar76,auVar57);
                    auVar101 = pblendvb(auVar91,auVar77,auVar54);
                    auVar60 = *(undefined1 (*) [16])((long)*ptr + lVar25);
                    lVar25 = lVar25 + 0x10;
                  } while (uVar31 << 4 != lVar25);
                  iVar21 = iVar21 + 1;
                } while (iVar21 != 8);
LAB_006ac076:
                uVar24 = uVar24 + 1;
                palVar20 = ptr_05;
                b_00 = local_188;
                b_01 = local_190;
                b = local_160;
                if (uVar24 == (uint)s2Len) {
                  uVar31 = ptr_05[uVar36][1];
                  uVar24 = local_160[uVar36][1];
                  uVar55 = local_188[uVar36][1];
                  uVar47 = local_190[uVar36][1];
                  if (iVar23 < 7) {
                    iVar21 = 0;
                    uVar63 = ptr_05[uVar36][0];
                    uVar56 = local_160[uVar36][0];
                    uVar51 = local_188[uVar36][0];
                    uVar36 = local_190[uVar36][0];
                    do {
                      uVar31 = uVar31 << 0x10 | uVar63 >> 0x30;
                      uVar24 = uVar24 << 0x10 | uVar56 >> 0x30;
                      uVar55 = uVar55 << 0x10 | uVar51 >> 0x30;
                      uVar47 = uVar47 << 0x10 | uVar36 >> 0x30;
                      iVar21 = iVar21 + 1;
                      uVar63 = uVar63 << 0x10;
                      uVar56 = uVar56 << 0x10;
                      uVar51 = uVar51 << 0x10;
                      uVar36 = uVar36 << 0x10;
                    } while (iVar21 < 7 - iVar23);
                  }
                  auVar92._0_2_ = -(ushort)((short)uVar62 < (short)local_b8);
                  auVar92._2_2_ = -(ushort)((short)uVar41 < (short)uStack_b6);
                  auVar92._4_2_ = -(ushort)((short)uVar66 < (short)local_b8);
                  auVar92._6_2_ = -(ushort)((short)uVar44 < (short)uStack_b6);
                  auVar92._8_2_ = -(ushort)((short)uStack_140 < (short)local_b8);
                  auVar92._10_2_ = -(ushort)((short)uStack_13e < (short)uStack_b6);
                  auVar92._12_2_ = -(ushort)((short)uStack_13c < (short)local_b8);
                  auVar92._14_2_ = -(ushort)((short)uStack_13a < (short)uStack_b6);
                  auVar78._0_2_ = -(ushort)((short)local_88 < (short)uVar75);
                  auVar78._2_2_ = -(ushort)((short)uStack_86 < (short)uVar79);
                  auVar78._4_2_ = -(ushort)((short)local_88 < (short)uVar81);
                  auVar78._6_2_ = -(ushort)((short)uStack_86 < (short)uVar82);
                  auVar78._8_2_ = -(ushort)((short)local_88 < (short)uVar84);
                  auVar78._10_2_ = -(ushort)((short)uStack_86 < (short)uVar85);
                  auVar78._12_2_ = -(ushort)((short)local_88 < (short)uVar87);
                  auVar78._14_2_ = -(ushort)((short)uStack_86 < (short)uVar88);
                  auVar78 = auVar78 | auVar92;
                  if ((((((((((((((((auVar78 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar78 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar78 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar78 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar78 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar78 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar78 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar78 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar78 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar78 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar78 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar78 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar78 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar78 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar78 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar78[0xf]) {
                    sVar16 = (short)(uVar31 >> 0x30);
                    sVar33 = (short)(uVar24 >> 0x30);
                    sVar42 = (short)(uVar55 >> 0x30);
                    sVar43 = (short)(uVar47 >> 0x30);
                  }
                  else {
                    *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                    sVar16 = 0;
                    sVar33 = 0;
                    sVar42 = 0;
                    sVar43 = 0;
                    iVar17 = 0;
                    uVar28 = 0;
                  }
                  ppVar19->score = (int)sVar16;
                  ppVar19->end_query = uVar28;
                  ppVar19->end_ref = iVar17;
                  *(int *)(ppVar19->field_4).extra = (int)sVar33;
                  ((ppVar19->field_4).stats)->similar = (int)sVar42;
                  ((ppVar19->field_4).stats)->length = (int)sVar43;
                  parasail_free(ptr_04);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(local_190);
                  parasail_free(ptr_01);
                  parasail_free(local_188);
                  parasail_free(ptr_00);
                  parasail_free(local_160);
                  parasail_free(ptr);
                  parasail_free(ptr_05);
                  return ppVar19;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}